

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book.cc
# Opt level: O3

uint64_t __thiscall helix::order_book::midprice(order_book *this,size_t level)

{
  _Self __tmp;
  _Rb_tree_node_base *p_Var1;
  _Base_ptr p_Var2;
  long lVar3;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  
  p_Var1 = (this->_bids)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->_bids)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 == p_Var4) {
    p_Var2 = (_Base_ptr)0x0;
  }
  else {
    lVar3 = level + 1;
    p_Var2 = (_Base_ptr)0x0;
    do {
      lVar3 = lVar3 + -1;
      if (lVar3 == 0) {
        p_Var2 = p_Var1[1]._M_parent;
        break;
      }
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var4);
  }
  p_Var1 = (this->_asks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->_asks)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (_Base_ptr)0xffffffffffffffff;
  if ((_Rb_tree_header *)p_Var1 != p_Var4) {
    lVar3 = level + 1;
    do {
      lVar3 = lVar3 + -1;
      if (lVar3 == 0) {
        p_Var5 = p_Var1[1]._M_parent;
        break;
      }
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var4);
  }
  return (ulong)((long)&p_Var2->_M_color + (long)&p_Var5->_M_color) >> 1;
}

Assistant:

uint64_t order_book::midprice(size_t level) const
{
    auto bid = bid_price(level);
    auto ask = ask_price(level);
    return (bid + ask) / 2;
}